

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractprintdialog.cpp
# Opt level: O2

void __thiscall QPrintDialog::done(QPrintDialog *this,int result)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff9c;
  QObject local_48 [8];
  code *local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (result == 1) {
    local_40 = QDialog::accepted;
    local_38 = 0;
    puVar3 = (undefined4 *)operator_new(0x18);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/printsupport/dialogs/qabstractprintdialog.cpp:372:58),_QtPrivate::List<>,_void>
         ::impl;
    *(QPrintDialog **)(puVar3 + 4) = this;
    QObject::connectImpl
              (local_48,(void **)this,(QObject *)&local_40,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,(int *)CONCAT44(in_stack_ffffffffffffff9c,0x100),
               (QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_48);
  }
  QDialog::done((int)this);
  this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x2f0);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    if ((this_00->d == (Data *)0x0) ||
       ((this_00->d->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = *(QObject **)(lVar1 + 0x2f8);
    }
    pcVar4 = *(char **)(lVar1 + 0x308);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,"2accepted(QPrinter*)",pQVar5,pcVar4);
    QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)0x0);
  }
  QByteArray::clear();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialog::done(int result)
{
    auto *d = static_cast<QAbstractPrintDialogPrivate *>(d_ptr.data());
    if (result == Accepted) {
        // Emit accepted(QPrinter*) at the same time as the dialog
        // is accepted. Doing it here is too late, as done() will
        // also emit finished().
        QObject::connect(this, &QDialog::accepted, this, [this]{
            emit accepted(printer());
        }, Qt::SingleShotConnection);
    }
    QDialog::done(result);
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, SIGNAL(accepted(QPrinter*)),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
}